

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O2

u32 __thiscall moira::Moira::shift<(moira::Instr)69,(moira::Size)2>(Moira *this,int cnt,u64 data)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  
  uVar1 = 0;
  iVar2 = 0;
  if (0 < cnt) {
    iVar2 = cnt;
  }
  while( true ) {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) break;
    uVar1 = (data & 0xffff) >> 0xf;
    data = data * 2;
  }
  if (cnt != 0) {
    (this->reg).sr.x = SUB81(uVar1,0);
  }
  (this->reg).sr.c = SUB81(uVar1,0);
  (this->reg).sr.v = false;
  (this->reg).sr.n = (bool)((byte)(data >> 0xf) & 1);
  (this->reg).sr.z = (short)data == 0;
  return (uint)data & 0xffff;
}

Assistant:

u32
Moira::shift(int cnt, u64 data) {

    switch(I) {

        case ASL:
        {
            bool carry = false;
            u32 changed = 0;
            for (int i = 0; i < cnt; i++) {
                carry = NBIT<S>(data);
                u64 shifted = data << 1;
                changed |= data ^ shifted;
                data = shifted;
            }
            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = NBIT<S>(changed);
            break;
        }
        case ASR:
        {
            bool carry = false;
            u32 changed = 0;
            for (int i = 0; i < cnt; i++) {
                carry = data & 1;
                u64 shifted = SEXT<S>(data) >> 1;
                changed |= data ^ shifted;
                data = shifted;
            }
            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = NBIT<S>(changed);
            break;
        }
        case LSL:
        {
            bool carry = false;
            for (int i = 0; i < cnt; i++) {
                carry = NBIT<S>(data);
                data = data << 1;
            }
            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case LSR:
        {
            bool carry = false;
            for (int i = 0; i < cnt; i++) {
                carry = data & 1;
                data = data >> 1;
            }
            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case ROL:
        {
            bool carry = false;
            for (int i = 0; i < cnt; i++) {
                carry = NBIT<S>(data);
                data = data << 1 | (carry ? 1 : 0);
            }
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case ROR:
        {
            bool carry = false;
            for (int i = 0; i < cnt; i++) {
                carry = data & 1;
                data >>= 1;
                if (carry) data |= MSBIT<S>();
            }
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case ROXL:
        {
            bool carry = reg.sr.x;
            for (int i = 0; i < cnt; i++) {
                bool extend = carry;
                carry = NBIT<S>(data);
                data = data << 1 | (extend ? 1 : 0);
            }

            reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case ROXR:
        {
            bool carry = reg.sr.x;
            for (int i = 0; i < cnt; i++) {
                bool extend = carry;
                carry = data & 1;
                data >>= 1;
                if (extend) data |= MSBIT<S>();
            }

            reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        default:
        {
            assert(false);
        }
    }
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    return CLIP<S>(data);
}